

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O1

void __thiscall
TEST_TestFailure_CreateFailure_Test::testBody(TEST_TestFailure_CreateFailure_Test *this)

{
  UtestShell *pUVar1;
  TestFailure f3;
  TestFailure f2;
  TestFailure f1;
  TestFailure local_150;
  TestFailure local_e8;
  TestFailure local_80;
  
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)&local_e8,"the failure message");
  TestFailure::TestFailure(&local_80,pUVar1,"fail.cpp",2,(SimpleString *)&local_e8);
  SimpleString::~SimpleString((SimpleString *)&local_e8);
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)&local_150,"the failure message");
  TestFailure::TestFailure(&local_e8,pUVar1,(SimpleString *)&local_150);
  SimpleString::~SimpleString((SimpleString *)&local_150);
  TestFailure::TestFailure
            (&local_150,(this->super_TEST_GROUP_CppUTestGroupTestFailure).test,"fail.cpp",2);
  TestFailure::~TestFailure(&local_150);
  TestFailure::~TestFailure(&local_e8);
  TestFailure::~TestFailure(&local_80);
  return;
}

Assistant:

TEST(TestFailure, CreateFailure)
{
    TestFailure f1(test, failFileName, failLineNumber, "the failure message");
    TestFailure f2(test, "the failure message");
    TestFailure f3(test, failFileName, failLineNumber);
}